

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O1

MemoryAccessMask __thiscall
anon_unknown.dwarf_deef1e::TGlslangToSpvTraverser::TranslateMemoryAccess
          (TGlslangToSpvTraverser *this,CoherentFlags *coherentFlags)

{
  ushort uVar1;
  MemoryAccessMask MVar2;
  Capability local_c;
  
  MVar2 = MaskNone;
  if (this->glslangIntermediate->useVulkanMemoryModel == true) {
    uVar1 = *(ushort *)coherentFlags;
    MVar2 = MaskNone;
    if ((uVar1 >> 9 & 1) == 0) {
      MVar2 = MakePointerVisible|MakePointerAvailable;
      if ((uVar1 & 0xbf) == 0) {
        MVar2 = uVar1 & 0xbf;
      }
      MVar2 = uVar1 >> 6 & MemoryAccessNontemporalMask |
              uVar1 >> 7 & MemoryAccessVolatileMask |
              uVar1 >> 1 & MemoryAccessNonPrivatePointerKHRMask | MVar2;
      if (MVar2 != MaskNone) {
        local_c = CapabilityVulkanMemoryModel;
        std::
        _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
        ::_M_insert_unique<spv::Capability_const&>
                  ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                    *)&(this->builder).capabilities,&local_c);
      }
    }
  }
  return MVar2;
}

Assistant:

spv::MemoryAccessMask TGlslangToSpvTraverser::TranslateMemoryAccess(
    const spv::Builder::AccessChain::CoherentFlags &coherentFlags)
{
    spv::MemoryAccessMask mask = spv::MemoryAccessMaskNone;

    if (!glslangIntermediate->usingVulkanMemoryModel() || coherentFlags.isImage)
        return mask;

    if (coherentFlags.isVolatile() || coherentFlags.anyCoherent()) {
        mask = mask | spv::MemoryAccessMakePointerAvailableKHRMask |
                      spv::MemoryAccessMakePointerVisibleKHRMask;
    }

    if (coherentFlags.nonprivate) {
        mask = mask | spv::MemoryAccessNonPrivatePointerKHRMask;
    }
    if (coherentFlags.volatil) {
        mask = mask | spv::MemoryAccessVolatileMask;
    }
    if (coherentFlags.nontemporal) {
        mask = mask | spv::MemoryAccessNontemporalMask;
    }
    if (mask != spv::MemoryAccessMaskNone) {
        builder.addCapability(spv::CapabilityVulkanMemoryModelKHR);
    }

    return mask;
}